

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unbuf.cc
# Opt level: O3

void __thiscall bsplib::Unbuf::start(Unbuf *this)

{
  long lVar1;
  pointer pEVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::resize
            (&this->m_reqs,
             ((long)(this->m_recvs).
                    super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_recvs).
                    super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 5) +
             ((long)(this->m_sends).
                    super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_sends).
                    super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 5));
  pEVar2 = (this->m_recvs).
           super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_recvs).
      super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>._M_impl.
      super__Vector_impl_data._M_finish == pEVar2) {
    uVar7 = 0;
  }
  else {
    lVar5 = 0;
    uVar7 = 0;
    do {
      uVar6 = *(ulong *)((long)&pEVar2->size + lVar5 * 4);
      uVar3 = this->m_max_msg_size;
      if (uVar6 < this->m_max_msg_size) {
        uVar3 = uVar6;
      }
      lVar1 = *(long *)((long)&pEVar2->addr + lVar5 * 4);
      *(ulong *)((long)&pEVar2->addr + lVar5 * 4) = lVar1 + uVar3;
      *(ulong *)((long)&pEVar2->size + lVar5 * 4) = uVar6 - uVar3;
      MPI_Irecv(lVar1,uVar3,&ompi_mpi_byte,(&pEVar2->pid)[lVar5],(&pEVar2->tag)[lVar5],this->m_comm,
                (long)(this->m_reqs).
                      super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar5);
      uVar7 = uVar7 + 1;
      pEVar2 = (this->m_recvs).
               super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 8;
    } while (uVar7 < (ulong)((long)(this->m_recvs).
                                   super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar2 >> 5));
  }
  MPI_Barrier(this->m_comm);
  pEVar2 = (this->m_sends).
           super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_sends).
      super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar2) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      uVar3 = *(ulong *)((long)&pEVar2->size + lVar5 * 4);
      uVar4 = this->m_max_msg_size;
      if (uVar3 < this->m_max_msg_size) {
        uVar4 = uVar3;
      }
      lVar1 = *(long *)((long)&pEVar2->addr + lVar5 * 4);
      *(ulong *)((long)&pEVar2->addr + lVar5 * 4) = lVar1 + uVar4;
      *(ulong *)((long)&pEVar2->size + lVar5 * 4) = uVar3 - uVar4;
      MPI_Irsend(lVar1,uVar4,&ompi_mpi_byte,(&pEVar2->pid)[lVar5],(&pEVar2->tag)[lVar5],this->m_comm
                 ,(long)(this->m_reqs).
                        super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar5 + uVar7 * 8);
      uVar6 = uVar6 + 1;
      pEVar2 = (this->m_sends).
               super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 8;
    } while (uVar6 < (ulong)((long)(this->m_sends).
                                   super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar2 >> 5));
  }
  std::vector<int,_std::allocator<int>_>::resize
            (&this->m_ready,
             (long)(this->m_reqs).
                   super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_reqs).
                   super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  return;
}

Assistant:

void Unbuf :: start( )
{
   m_reqs.resize( m_sends.size() + m_recvs.size() );
   size_t j = 0;
   for ( size_t i = 0 ; i < m_recvs.size(); ++j, ++i ) {
       Entry & u = m_recvs[i];
       size_t size = std::min( m_max_msg_size, u.size );
       char * addr = const_cast<char *>( u.addr );
       char * next_addr = addr + size;
       u.addr = next_addr;
       u.size -= size;
       const int tag = u.tag;
       MPI_Irecv( addr, int(size), MPI_BYTE, u.pid, tag, m_comm, &m_reqs[j]);
   }

   MPI_Barrier( m_comm ); // so we can use ready sends

   for ( size_t i = 0 ; i < m_sends.size(); ++j, ++i ) {
       Entry & u = m_sends[i];
       size_t size = std::min( m_max_msg_size, u.size );
       char * addr = const_cast<char *>( u.addr );
       char * next_addr = addr + size;
       u.addr = next_addr;
       u.size -= size;
       const int tag = u.tag;
       MPI_Irsend( addr, int(size), MPI_BYTE, u.pid, tag, m_comm, &m_reqs[j]);
   }

   m_ready.resize( m_reqs.size() );
}